

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O1

void __thiscall Line::generate_options(Line *this,Known *known)

{
  ulong *puVar1;
  pointer piVar2;
  bool bVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int *single_required;
  ulong *puVar9;
  int *piVar10;
  vector<int,std::allocator<int>> *pvVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  uint uVar15;
  ulong *puVar16;
  uint uVar17;
  ulong uVar18;
  vector<int,std::allocator<int>> *unaff_R15;
  vector<int,_std::allocator<int>_> required;
  vector<int,_std::allocator<int>_> iterators;
  vector<bool,_std::allocator<bool>_> option;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  generated_possibilities;
  allocator_type local_b9;
  int *local_b8;
  iterator iStack_b0;
  int *local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  vector<bool,_std::allocator<bool>_> local_88;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_60;
  
  puVar9 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar1 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar15 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  lVar13 = (long)((ulong)uVar15 + ((long)puVar1 - (long)puVar9) * 8) >> 2;
  if (lVar13 < 1) {
    uVar18 = 0;
  }
  else {
    lVar13 = lVar13 + 1;
    uVar18 = 0;
    do {
      uVar6 = (uint)uVar18;
      puVar16 = puVar9;
      if ((*puVar9 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_00105d20;
      puVar16 = puVar9 + (uVar6 == 0x3f);
      uVar18 = (ulong)(uVar6 + 1);
      if (uVar6 == 0x3f) {
        uVar18 = 0;
      }
      uVar6 = (uint)uVar18;
      if ((*puVar16 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_00105d20;
      puVar16 = puVar16 + (uVar6 == 0x3f);
      uVar18 = (ulong)(uVar6 + 1);
      if (uVar6 == 0x3f) {
        uVar18 = 0;
      }
      uVar6 = (uint)uVar18;
      if ((*puVar16 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_00105d20;
      uVar18 = 0;
      if (uVar6 != 0x3f) {
        uVar18 = (ulong)(uVar6 + 1);
      }
      uVar8 = (uint)uVar18;
      puVar16 = puVar16 + (uVar6 == 0x3f);
      uVar6 = uVar8;
      if ((*puVar16 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_00105d20;
      uVar18 = 0;
      if (uVar8 != 0x3f) {
        uVar18 = (ulong)(uVar8 + 1);
      }
      puVar9 = puVar16 + (uVar8 == 0x3f);
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  uVar8 = (uint)uVar18;
  lVar13 = (uVar15 - uVar18) + ((long)puVar1 - (long)puVar9) * 8;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      puVar16 = puVar1;
      uVar6 = uVar15;
      if ((lVar13 != 3) || (puVar16 = puVar9, uVar6 = uVar8, (*puVar9 >> (uVar18 & 0x3f) & 1) == 0))
      goto LAB_00105d20;
      uVar18 = 0;
      puVar9 = puVar9 + (uVar8 == 0x3f);
      if (uVar8 != 0x3f) {
        uVar18 = (ulong)(uVar8 + 1);
      }
    }
    uVar6 = (uint)uVar18;
    puVar16 = puVar9;
    if ((*puVar9 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_00105d20;
    puVar9 = puVar9 + (uVar6 == 0x3f);
    uVar8 = 0;
    if (uVar6 != 0x3f) {
      uVar8 = uVar6 + 1;
    }
    uVar18 = (ulong)uVar8;
  }
  puVar16 = puVar9;
  uVar6 = (uint)uVar18;
  if ((*puVar9 >> (uVar18 & 0x3f) & 1) != 0) {
    puVar16 = puVar1;
    uVar6 = uVar15;
  }
LAB_00105d20:
  if ((puVar16 == puVar1) && (uVar6 == uVar15)) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_60,&known->second);
    std::
    vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
    ::_M_assign_aux<std::vector<bool,std::allocator<bool>>const*>
              ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                *)this,&local_60,
               &local_60.second.
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              ((_Bvector_base<std::allocator<bool>_> *)&local_60);
  }
  else {
    generate_possible_per_number(&local_60,this,known);
    local_b8 = (int *)0x0;
    iStack_b0._M_current = (int *)0x0;
    local_a8 = (int *)0x0;
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    if (this->m_size != 0) {
      unaff_R15 = (vector<int,std::allocator<int>> *)&local_b8;
      do {
        uVar7 = (ulong)(int)(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar18 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar18 = uVar7;
        }
        uVar12 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
        if (((*(ulong *)((long)(known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         ((long)uVar18 >> 6) * 8 + -8 + uVar12 * 8) >> (uVar7 & 0x3f) & 1) != 0) &&
           (((known->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar18 >> 6) + uVar12 + 0xffffffffffffffff] &
            1L << ((byte)(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                  0x3f)) != 0)) {
          if (iStack_b0._M_current == local_a8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (unaff_R15,iStack_b0,(int *)&local_88);
          }
          else {
            *iStack_b0._M_current =
                 (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p._0_4_ =
             (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
      } while ((uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p < this->m_size)
      ;
    }
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_ << 0x20);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_a0,
               (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_88,
               &local_b9);
    do {
      generate_option(&local_88,this,&local_a0,&local_60.first);
      for (piVar10 = local_b8; iVar5 = -1, piVar10 != iStack_b0._M_current; piVar10 = piVar10 + 1) {
        iVar5 = *piVar10;
        uVar7 = (ulong)iVar5;
        uVar18 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar18 = uVar7;
        }
        if ((local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar18 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] & 1L << ((byte)iVar5 & 0x3f)) == 0) break;
      }
      if (iVar5 == -1) {
        std::
        vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
        ::emplace_back<std::vector<bool,std::allocator<bool>>>
                  ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                    *)this,&local_88);
LAB_00105f79:
        bVar3 = false;
        uVar15 = (uint)unaff_R15;
LAB_00105f87:
        if (!bVar3) {
          unaff_R15 = (vector<int,std::allocator<int>> *)
                      ((ulong)((long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
          uVar18 = (ulong)unaff_R15 & 0xffffffff;
          uVar6 = (int)(uint)unaff_R15 >> 0x1f & (uint)unaff_R15;
          do {
            uVar18 = uVar18 - 1;
            uVar15 = (uint)unaff_R15;
            if ((int)uVar15 < 1) {
              unaff_R15 = (vector<int,std::allocator<int>> *)(ulong)(uVar6 - 1);
              uVar15 = uVar6;
              break;
            }
            uVar7 = uVar18 & 0xffffffff;
            unaff_R15 = (vector<int,std::allocator<int>> *)(ulong)(uVar15 - 1);
          } while (((long)local_60.first.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_60.first.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) + -1 ==
                   (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7]);
          if ((int)uVar15 < 1) goto LAB_001060a2;
          local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)unaff_R15] =
               local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(long)unaff_R15] + 1;
        }
        piVar2 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar11 = (vector<int,std::allocator<int>> *)
                  ((long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
        unaff_R15 = (vector<int,std::allocator<int>> *)(long)(int)uVar15;
        bVar3 = true;
        if (unaff_R15 < pvVar11) {
          do {
            piVar10 = local_60.first.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)unaff_R15].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            uVar18 = (long)local_60.first.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)unaff_R15].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
            piVar14 = piVar10;
            if (0 < (long)uVar18) {
              do {
                uVar7 = uVar18 >> 1;
                uVar18 = ~uVar7 + uVar18;
                piVar4 = piVar14 + uVar7 + 1;
                if (piVar2[(long)(unaff_R15 + -1)] +
                    local_60.first.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)(unaff_R15 + -1)].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)(unaff_R15 + -1)]] <
                    piVar14[uVar7]) {
                  uVar18 = uVar7;
                  piVar4 = piVar14;
                }
                piVar14 = piVar4;
              } while (0 < (long)uVar18);
            }
            local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)unaff_R15] = (int)((ulong)((long)piVar14 - (long)piVar10) >> 2);
            unaff_R15 = unaff_R15 + 1;
          } while (unaff_R15 < pvVar11);
        }
        else {
          unaff_R15 = (vector<int,std::allocator<int>> *)(ulong)uVar15;
        }
      }
      else {
        uVar18 = (ulong)((long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar7 = uVar18 & 0xffffffff;
        uVar15 = (int)uVar18 - 1;
        if (-2 < (int)uVar15) {
          uVar15 = 0xffffffff;
        }
        do {
          uVar7 = uVar7 - 1;
          uVar8 = (int)uVar18 - 1;
          uVar18 = (ulong)uVar8;
          uVar6 = uVar15;
          if ((int)uVar8 < 0) break;
          uVar17 = (uint)uVar7 & 0x7fffffff;
          uVar6 = uVar8;
        } while (iVar5 < local_60.first.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17]]);
        uVar15 = uVar6 + 1;
        if (-1 < (int)uVar6) {
          if (((long)local_60.first.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish -
               (long)local_60.first.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start >> 2) + -1 ==
              (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6]) goto LAB_00105f79;
          local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6] =
               local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6] + 1;
          bVar3 = true;
          goto LAB_00105f87;
        }
LAB_001060a2:
        bVar3 = false;
      }
      if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
    } while (bVar3);
    if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8 != (int *)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~vector(&local_60.second);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_60.first);
  }
  return;
}

Assistant:

void Line::generate_options(const Known &known) {
#if DEBUG_LOGS
    Logger(DEBUG).get() << "Originally possible " << get_combinations_number() << " options" << endl;
#endif // DEBUG_LOGS

    if (all_of(known.first.begin(), known.first.end(), [](bool v) { return v; })) {
        m_options = {known.second};

#if DEBUG_LOGS
        Logger(DEBUG).get() << "All known" << endl;
#endif // DEBUG_LOGS

        return;
    }

    auto generated_possibilities = generate_possible_per_number(known);
    vector<vector<int>> &possible_per_number = generated_possibilities.first;
    vector<set<int>> &extended_possible_per_place = generated_possibilities.second;

    // Get known black.
    vector<int> required;
    for (int i = 0; i < m_size; i++) {
        if (known.first[i] && known.second[i]) {
            required.push_back(i);
        }
    }

    vector<int> iterators(m_numbers.size(), 0);
    int index;
    int required_filler;
    int generated = 0;

    // Generate all options for the line.
    while (true) {
        bool advanced = false;
        auto option = generate_option(iterators, possible_per_number);
        generated++;

        int failed_required = check_option_by_required(required, option);
        if (failed_required == -1) {
            m_options.push_back(move(option));
        } else {
            for (required_filler = m_numbers.size() - 1;
                 (required_filler >= 0) && (possible_per_number[required_filler][iterators[required_filler]] >
                                            failed_required); required_filler--);
            if (required_filler < 0) break;
            if (iterators[required_filler] != possible_per_number[required_filler].size() - 1) {
                iterators[required_filler]++;
                advanced = true;
                index = required_filler + 1;
            }
        }

        if (!advanced) {
            for (index = (int) m_numbers.size() - 1;
                 (index >= 0) && (iterators[index] == possible_per_number[index].size() - 1); index--);
            if (index < 0) break;

            iterators[index]++;
            index++;
        }

        for (; index < m_numbers.size(); index++) {
            int lower_limit = possible_per_number[index - 1][iterators[index - 1]] + m_numbers[index - 1] + 1;
            auto t = lower_bound(possible_per_number[index].begin(), possible_per_number[index].end(), lower_limit);
            iterators[index] = t - possible_per_number[index].begin();
        }
    }

#if DEBUG_LOGS
    Logger(DEBUG).get() << "Generated " << m_options.size() << " options (saved "
                        << get_combinations_number() - generated << " by optimization and "
                        << generated - m_options.size() << " by filtering)" << endl;
#endif // DEBUG_LOGS
}